

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O1

void ImGui_ImplSDL2_SetGamepadMode
               (ImGui_ImplSDL2_GamepadMode mode,_SDL_GameController **manual_gamepads_array,
               int manual_gamepads_count)

{
  int iVar1;
  ImGuiContext *pIVar2;
  ImGuiIO *pIVar3;
  void *__dest;
  int iVar4;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  
  pIVar2 = ImGui::GetCurrentContext();
  if (pIVar2 == (ImGuiContext *)0x0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pIVar3 = ImGui::GetIO();
    pvVar7 = pIVar3->BackendPlatformUserData;
  }
  ImGui_ImplSDL2_CloseGamepads();
  if (mode == ImGui_ImplSDL2_GamepadMode_Manual) {
    if (0 < manual_gamepads_count) {
      uVar6 = 0;
      do {
        iVar1 = *(int *)((long)pvVar7 + 0x84);
        if (*(int *)((long)pvVar7 + 0x80) == iVar1) {
          if (iVar1 == 0) {
            iVar4 = 8;
          }
          else {
            iVar4 = iVar1 / 2 + iVar1;
          }
          iVar5 = *(int *)((long)pvVar7 + 0x80) + 1;
          if (iVar5 < iVar4) {
            iVar5 = iVar4;
          }
          if (iVar1 < iVar5) {
            __dest = ImGui::MemAlloc((long)iVar5 << 3);
            if (*(void **)((long)pvVar7 + 0x88) != (void *)0x0) {
              memcpy(__dest,*(void **)((long)pvVar7 + 0x88),(long)*(int *)((long)pvVar7 + 0x80) << 3
                    );
              ImGui::MemFree(*(void **)((long)pvVar7 + 0x88));
            }
            *(void **)((long)pvVar7 + 0x88) = __dest;
            *(int *)((long)pvVar7 + 0x84) = iVar5;
          }
        }
        *(_SDL_GameController **)
         (*(long *)((long)pvVar7 + 0x88) + (long)*(int *)((long)pvVar7 + 0x80) * 8) =
             manual_gamepads_array[uVar6];
        *(int *)((long)pvVar7 + 0x80) = *(int *)((long)pvVar7 + 0x80) + 1;
        uVar6 = uVar6 + 1;
      } while ((uint)manual_gamepads_count != uVar6);
    }
  }
  else {
    *(undefined1 *)((long)pvVar7 + 0x94) = 1;
  }
  *(ImGui_ImplSDL2_GamepadMode *)((long)pvVar7 + 0x90) = mode;
  return;
}

Assistant:

void ImGui_ImplSDL2_SetGamepadMode(ImGui_ImplSDL2_GamepadMode mode, struct _SDL_GameController** manual_gamepads_array, int manual_gamepads_count)
{
    ImGui_ImplSDL2_Data* bd = ImGui_ImplSDL2_GetBackendData();
    ImGui_ImplSDL2_CloseGamepads();
    if (mode == ImGui_ImplSDL2_GamepadMode_Manual)
    {
        IM_ASSERT(manual_gamepads_array != nullptr && manual_gamepads_count > 0);
        for (int n = 0; n < manual_gamepads_count; n++)
            bd->Gamepads.push_back(manual_gamepads_array[n]);
    }
    else
    {
        IM_ASSERT(manual_gamepads_array == nullptr && manual_gamepads_count <= 0);
        bd->WantUpdateGamepadsList = true;
    }
    bd->GamepadMode = mode;
}